

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnStartFunction
          (BinaryReaderObjdump *this,Index func_index)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  undefined1 local_30 [8];
  string_view name;
  Index func_index_local;
  BinaryReaderObjdump *this_local;
  
  name._M_str._4_4_ = func_index;
  if (((this->super_BinaryReaderObjdumpBase).options_)->mode == Headers) {
    printf("start: %u\n");
  }
  else {
    PrintDetails(this," - start function: %u",(ulong)func_index);
    _local_30 = BinaryReaderObjdumpBase::GetFunctionName
                          (&this->super_BinaryReaderObjdumpBase,name._M_str._4_4_);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    if (!bVar1) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pvVar3);
    }
    PrintDetails(this,"\n");
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnStartFunction(Index func_index) {
  if (options_->mode == ObjdumpMode::Headers) {
    printf("start: %" PRIindex "\n", func_index);
  } else {
    PrintDetails(" - start function: %" PRIindex, func_index);
    auto name = GetFunctionName(func_index);
    if (!name.empty()) {
      PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
    }
    PrintDetails("\n");
  }
  return Result::Ok;
}